

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGXMLScanner.cpp
# Opt level: O0

Grammar * __thiscall
xercesc_4_0::SGXMLScanner::loadXMLSchemaGrammar(SGXMLScanner *this,InputSource *src,bool toCache)

{
  RefHash2KeysTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher> *this_00;
  XMLStringPool *pXVar1;
  XMLValidator *pXVar2;
  bool bVar3;
  int iVar4;
  DOMDocument *pDVar5;
  DOMElement *schemaRoot;
  XMLCh *namespaceKey;
  XMLCh *schemaURL;
  long *plVar6;
  SchemaInfo *this_01;
  PSVIHandler *pPVar7;
  XSModel *pXVar8;
  RefHash2KeysTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher> *local_560;
  RefHash2KeysTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher> *local_558;
  bool local_501;
  undefined1 local_488 [8];
  RefHash2KeysTableOfEnumerator<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher> i;
  TraverseSchema traverseSchema;
  XMLSchemaDescription *gramDesc;
  SchemaGrammar *schemaGrammar;
  SchemaInfo *pSStack_200;
  bool grammarFound;
  SchemaInfo *importSchemaInfo;
  XMLCh *sysId;
  Grammar *grammar;
  XMLCh *nsUri;
  DOMElement *root;
  DOMDocument *document;
  bool flag;
  undefined1 local_1c0 [8];
  XSDDOMParser parser;
  bool toCache_local;
  InputSource *src_local;
  SGXMLScanner *this_local;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  parser.fXSLocator.fPublicId._7_1_ = toCache;
  (*(this->fSchemaValidator->super_XMLValidator)._vptr_XMLValidator[6])();
  SchemaValidator::setErrorReporter(this->fSchemaValidator,(this->super_XMLScanner).fErrorReporter);
  SchemaValidator::setExitOnFirstFatal
            (this->fSchemaValidator,(bool)((this->super_XMLScanner).fExitOnFirstFatal & 1));
  SchemaValidator::setGrammarResolver
            (this->fSchemaValidator,(this->super_XMLScanner).fGrammarResolver);
  if (((this->super_XMLScanner).fValidatorFromUser & 1U) != 0) {
    (*((this->super_XMLScanner).fValidator)->_vptr_XMLValidator[6])();
  }
  XSDDOMParser::XSDDOMParser
            ((XSDDOMParser *)local_1c0,(XMLValidator *)0x0,(this->super_XMLScanner).fMemoryManager,
             (XMLGrammarPool *)0x0);
  AbstractDOMParser::setValidationScheme((AbstractDOMParser *)local_1c0,Val_Never);
  AbstractDOMParser::setDoNamespaces((AbstractDOMParser *)local_1c0,true);
  XSDDOMParser::setUserEntityHandler
            ((XSDDOMParser *)local_1c0,(this->super_XMLScanner).fEntityHandler);
  XSDDOMParser::setUserErrorReporter
            ((XSDDOMParser *)local_1c0,(this->super_XMLScanner).fErrorReporter);
  iVar4 = (*src->_vptr_InputSource[6])();
  (*src->_vptr_InputSource[10])(src,0);
  AbstractDOMParser::parse((AbstractDOMParser *)local_1c0,src);
  (*src->_vptr_InputSource[10])(src,(ulong)((byte)iVar4 & 1));
  bVar3 = XSDDOMParser::getSawFatal((XSDDOMParser *)local_1c0);
  if ((bVar3) && (((this->super_XMLScanner).fExitOnFirstFatal & 1U) != 0)) {
    XMLScanner::emitError(&this->super_XMLScanner,SchemaScanFatalError);
  }
  pDVar5 = AbstractDOMParser::getDocument((AbstractDOMParser *)local_1c0);
  if (pDVar5 != (DOMDocument *)0x0) {
    iVar4 = (*(pDVar5->super_DOMDocumentRange)._vptr_DOMDocumentRange[0xd])();
    schemaRoot = (DOMElement *)CONCAT44(extraout_var,iVar4);
    if (schemaRoot != (DOMElement *)0x0) {
      iVar4 = (*(schemaRoot->super_DOMNode)._vptr_DOMNode[0x29])
                        (schemaRoot,SchemaSymbols::fgATT_TARGETNAMESPACE);
      namespaceKey = (XMLCh *)CONCAT44(extraout_var_00,iVar4);
      gramDesc = (XMLSchemaDescription *)
                 GrammarResolver::getGrammar((this->super_XMLScanner).fGrammarResolver,namespaceKey)
      ;
      iVar4 = (*src->_vptr_InputSource[5])();
      schemaURL = (XMLCh *)CONCAT44(extraout_var_01,iVar4);
      pSStack_200 = (SchemaInfo *)0x0;
      if (gramDesc != (XMLSchemaDescription *)0x0) {
        if ((namespaceKey == (XMLCh *)0x0) || (*namespaceKey == L'\0')) {
          pSStack_200 = RefHash2KeysTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher>::get
                                  (this->fCachedSchemaInfoList,schemaURL,
                                   (this->super_XMLScanner).fEmptyNamespaceId);
        }
        else {
          this_00 = this->fCachedSchemaInfoList;
          pXVar1 = (this->super_XMLScanner).fURIStringPool;
          iVar4 = (*(pXVar1->super_XSerializable)._vptr_XSerializable[5])(pXVar1,namespaceKey);
          pSStack_200 = RefHash2KeysTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher>::get
                                  (this_00,schemaURL,iVar4);
        }
      }
      sysId = (XMLCh *)gramDesc;
      if (pSStack_200 == (SchemaInfo *)0x0) {
        local_501 = false;
        if (gramDesc != (XMLSchemaDescription *)0x0) {
          iVar4 = (*(gramDesc->super_XMLGrammarDescription).super_XSerializable._vptr_XSerializable
                    [5])();
          local_501 = false;
          if (iVar4 == 1) {
            local_501 = XMLScanner::getHandleMultipleImports(&this->super_XMLScanner);
          }
        }
        if (local_501 == false) {
          gramDesc = (XMLSchemaDescription *)
                     XMemory::operator_new(0x98,(this->super_XMLScanner).fGrammarPoolMemoryManager);
          SchemaGrammar::SchemaGrammar
                    ((SchemaGrammar *)gramDesc,(this->super_XMLScanner).fGrammarPoolMemoryManager);
        }
        iVar4 = (*(gramDesc->super_XMLGrammarDescription).super_XSerializable._vptr_XSerializable
                  [0x16])();
        plVar6 = (long *)CONCAT44(extraout_var_02,iVar4);
        (**(code **)(*plVar6 + 0x68))(plVar6,3);
        (**(code **)(*plVar6 + 0x78))(plVar6,schemaURL);
        if ((parser.fXSLocator.fPublicId._7_1_ & 1) == 0) {
          local_558 = this->fSchemaInfoList;
        }
        else {
          local_558 = this->fCachedSchemaInfoList;
        }
        TraverseSchema::TraverseSchema
                  ((TraverseSchema *)&i.fLockPrimaryKey,schemaRoot,
                   (this->super_XMLScanner).fURIStringPool,(SchemaGrammar *)gramDesc,
                   (this->super_XMLScanner).fGrammarResolver,this->fCachedSchemaInfoList,local_558,
                   &this->super_XMLScanner,schemaURL,(this->super_XMLScanner).fEntityHandler,
                   (this->super_XMLScanner).fErrorReporter,(this->super_XMLScanner).fMemoryManager,
                   local_501);
        sysId = (XMLCh *)gramDesc;
        if ((parser.fXSLocator.fPublicId._7_1_ & 1) == 0) {
          local_560 = this->fSchemaInfoList;
        }
        else {
          local_560 = this->fCachedSchemaInfoList;
        }
        RefHash2KeysTableOfEnumerator<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher>::
        RefHash2KeysTableOfEnumerator
                  ((RefHash2KeysTableOfEnumerator<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher>
                    *)local_488,local_560,false,XMLPlatformUtils::fgMemoryManager);
        while (bVar3 = RefHash2KeysTableOfEnumerator<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher>
                       ::hasMoreElements((RefHash2KeysTableOfEnumerator<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher>
                                          *)local_488), bVar3) {
          this_01 = RefHash2KeysTableOfEnumerator<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher>
                    ::nextElement((RefHash2KeysTableOfEnumerator<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher>
                                   *)local_488);
          SchemaInfo::resetRoot(this_01);
        }
        RefHash2KeysTableOfEnumerator<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher>::
        ~RefHash2KeysTableOfEnumerator
                  ((RefHash2KeysTableOfEnumerator<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher>
                    *)local_488);
        TraverseSchema::~TraverseSchema((TraverseSchema *)&i.fLockPrimaryKey);
      }
      if (((this->super_XMLScanner).fValidate & 1U) != 0) {
        pXVar2 = (this->super_XMLScanner).fValidator;
        (*pXVar2->_vptr_XMLValidator[0xb])(pXVar2,sysId);
        pXVar2 = (this->super_XMLScanner).fValidator;
        (*pXVar2->_vptr_XMLValidator[4])(pXVar2,0);
      }
      if ((parser.fXSLocator.fPublicId._7_1_ & 1) != 0) {
        GrammarResolver::cacheGrammars((this->super_XMLScanner).fGrammarResolver);
      }
      pPVar7 = XMLScanner::getPSVIHandler(&this->super_XMLScanner);
      if (pPVar7 != (PSVIHandler *)0x0) {
        pXVar8 = GrammarResolver::getXSModel((this->super_XMLScanner).fGrammarResolver);
        this->fModel = pXVar8;
      }
      this_local = (SGXMLScanner *)sysId;
      goto LAB_00371816;
    }
  }
  this_local = (SGXMLScanner *)0x0;
LAB_00371816:
  XSDDOMParser::~XSDDOMParser((XSDDOMParser *)local_1c0);
  return (Grammar *)this_local;
}

Assistant:

Grammar* SGXMLScanner::loadXMLSchemaGrammar(const InputSource& src,
                                          const bool toCache)
{
   // Reset the validators
    fSchemaValidator->reset();
    fSchemaValidator->setErrorReporter(fErrorReporter);
    fSchemaValidator->setExitOnFirstFatal(fExitOnFirstFatal);
    fSchemaValidator->setGrammarResolver(fGrammarResolver);

    if (fValidatorFromUser)
        fValidator->reset();

    XSDDOMParser parser(0, fMemoryManager, 0);

    parser.setValidationScheme(XercesDOMParser::Val_Never);
    parser.setDoNamespaces(true);
    parser.setUserEntityHandler(fEntityHandler);
    parser.setUserErrorReporter(fErrorReporter);

    // Should just issue warning if the schema is not found
    bool flag = src.getIssueFatalErrorIfNotFound();
    ((InputSource&) src).setIssueFatalErrorIfNotFound(false);

    parser.parse(src);

    // Reset the InputSource
    ((InputSource&) src).setIssueFatalErrorIfNotFound(flag);

    if (parser.getSawFatal() && fExitOnFirstFatal)
        emitError(XMLErrs::SchemaScanFatalError);

    DOMDocument* document = parser.getDocument(); //Our Grammar

    if (document != 0) {

        DOMElement* root = document->getDocumentElement();// This is what we pass to TraverserSchema
        if (root != 0)
        {
            const XMLCh* nsUri = root->getAttribute(SchemaSymbols::fgATT_TARGETNAMESPACE);
            Grammar* grammar = fGrammarResolver->getGrammar(nsUri);

            // Check if this exact schema has already been seen.
            //
            const XMLCh* sysId = src.getSystemId();
            SchemaInfo* importSchemaInfo = 0;

            if (grammar)
            {
              if (nsUri && *nsUri)
                importSchemaInfo = fCachedSchemaInfoList->get(sysId, fURIStringPool->addOrFind(nsUri));
              else
                importSchemaInfo = fCachedSchemaInfoList->get(sysId, fEmptyNamespaceId);
            }

            if (!importSchemaInfo)
            {
              bool grammarFound = grammar &&
                grammar->getGrammarType() == Grammar::SchemaGrammarType &&
                getHandleMultipleImports();

              SchemaGrammar* schemaGrammar;

              if (grammarFound)
                schemaGrammar = (SchemaGrammar*) grammar;
              else
                schemaGrammar = new (fGrammarPoolMemoryManager) SchemaGrammar(fGrammarPoolMemoryManager);

              XMLSchemaDescription* gramDesc = (XMLSchemaDescription*) schemaGrammar->getGrammarDescription();
              gramDesc->setContextType(XMLSchemaDescription::CONTEXT_PREPARSE);
              gramDesc->setLocationHints(sysId);

              TraverseSchema traverseSchema
                (
                  root
                  , fURIStringPool
                  , schemaGrammar
                  , fGrammarResolver
                  , fCachedSchemaInfoList
                  , toCache ? fCachedSchemaInfoList : fSchemaInfoList
                  , this
                  , sysId
                  , fEntityHandler
                  , fErrorReporter
                  , fMemoryManager
                  , grammarFound
                );

              grammar = schemaGrammar;

              // Reset the now invalid schema roots in the collected
              // schema info entries.
              //
              {
                RefHash2KeysTableOfEnumerator<SchemaInfo> i (
                  toCache ? fCachedSchemaInfoList : fSchemaInfoList);

                while (i.hasMoreElements ())
                  i.nextElement().resetRoot ();
              }
            }

            if (fValidate) {
              //  validate the Schema scan so far
              fValidator->setGrammar(grammar);
              fValidator->preContentValidation(false);
            }

            if (toCache) {
              fGrammarResolver->cacheGrammars();
            }

            if(getPSVIHandler())
              fModel = fGrammarResolver->getXSModel();

            return grammar;
        }
    }

    return 0;
}